

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall UdpSocketImpl::WriteThread(UdpSocketImpl *this)

{
  unsigned_long __n;
  __tuple_element_t<1UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long,_basic_string<char>_>_>
  _Var1;
  int iVar2;
  int iVar3;
  memory_order mVar4;
  __int_type _Var5;
  reference pvVar6;
  __tuple_element_t<1UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long,_basic_string<char>_>_>
  *p_Var7;
  __tuple_element_t<2UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long,_basic_string<char>_>_>
  *p_Var8;
  char *pcVar9;
  char *pcVar10;
  __tuple_element_t<0UL,_tuple<unique_ptr<unsigned_char[],_default_delete<unsigned_char[]>_>,_unsigned_long,_basic_string<char>_>_>
  *p_Var11;
  type puVar12;
  ulong uVar13;
  type puVar14;
  int *piVar15;
  atomic_uchar *this_00;
  bool bVar16;
  unsigned_long uStack_2a0;
  uchar cExpected;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_298;
  __array tmp_1;
  __array tmp;
  string local_280 [4];
  uint32_t transferred;
  string local_260 [32];
  long local_240;
  size_t nPos;
  string local_230 [32];
  string local_210 [32];
  long local_1f0;
  size_t nPosE;
  size_t nPosS;
  addrinfo *lstAddr;
  DATA data;
  socklen_t iLen;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_180 [4];
  uint __i;
  timeval timeout;
  fd_set errorfd;
  fd_set writefd;
  undefined1 local_58 [8];
  unique_lock<std::mutex> lock;
  UdpSocketImpl *this_local;
  bool local_26;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_58,&this->m_mxWrite);
  do {
    while( true ) {
      do {
        bVar16 = true;
        if ((this->m_bCloseReq & 1U) != 0) {
          _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base *)&this->m_atOutBytes);
          bVar16 = _Var5 != 0;
        }
        if (!bVar16) goto LAB_001378e6;
        if (((this->m_bCloseReq & 1U) == 0) &&
           (_Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base *)&this->m_atOutBytes), _Var5 == 0)) {
          std::condition_variable::wait<UdpSocketImpl::WriteThread()::__0>
                    (&this->m_cv,(unique_lock<std::mutex> *)local_58,(anon_class_8_1_8991fb9c)this);
        }
        _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base *)&this->m_atOutBytes);
      } while (_Var5 == 0);
      memset(errorfd.fds_bits + 0xf,0,0x80);
      memset(&timeout.tv_usec,0,0x80);
      memset(auStack_180,0,0x10);
      _auStack_180 = 1;
      timeout.tv_sec = 0;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        errorfd.fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
      }
      for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
        errorfd.fds_bits[(ulong)__arr_1._4_4_ - 1] = 0;
      }
      iVar3 = (this->super_BaseSocketImpl).m_fSock;
      iVar2 = iVar3;
      if (iVar3 < 0) {
        iVar2 = iVar3 + 0x3f;
      }
      errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] =
           errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] | 1L << ((ulong)(byte)iVar3 & 0x3f);
      iVar3 = (this->super_BaseSocketImpl).m_fSock;
      iVar2 = iVar3;
      if (iVar3 < 0) {
        iVar2 = iVar3 + 0x3f;
      }
      errorfd.fds_bits[(long)(iVar2 >> 6) + -1] =
           errorfd.fds_bits[(long)(iVar2 >> 6) + -1] | 1L << ((ulong)(byte)iVar3 & 0x3f);
      iVar3 = select((this->super_BaseSocketImpl).m_fSock + 1,(fd_set *)0x0,
                     (fd_set *)(errorfd.fds_bits + 0xf),(fd_set *)&timeout.tv_usec,
                     (timeval *)auStack_180);
      if (iVar3 == 0) break;
      if ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + -1] &
          1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) != 0) {
        if ((this->super_BaseSocketImpl).m_iError == 0) {
          data.
          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 4;
          getsockopt((this->super_BaseSocketImpl).m_fSock,1,4,&(this->super_BaseSocketImpl).m_iError
                     ,(socklen_t *)
                      ((long)&data.
                              super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .
                              super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                              ._M_head_impl._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 4));
          (this->super_BaseSocketImpl).m_iErrLoc = 5;
          bVar16 = std::function::operator_cast_to_bool
                             ((function *)&(this->super_BaseSocketImpl).m_fErrorParam);
          if ((bVar16) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
            std::function<void_(BaseSocket_*,_void_*)>::operator()
                      (&(this->super_BaseSocketImpl).m_fErrorParam,
                       (this->super_BaseSocketImpl).m_pBkRef,
                       (this->super_BaseSocketImpl).m_pvUserData);
          }
          else {
            bVar16 = std::function::operator_cast_to_bool
                               ((function *)&(this->super_BaseSocketImpl).m_fError);
            if ((bVar16) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
              std::function<void_(BaseSocket_*)>::operator()
                        (&(this->super_BaseSocketImpl).m_fError,
                         (this->super_BaseSocketImpl).m_pBkRef);
            }
          }
        }
        goto LAB_001378e6;
      }
      std::mutex::lock(&this->m_mxOutDeque);
      pvVar6 = std::
               deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::front(&this->m_quOutData);
      std::
      tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&lstAddr,pvVar6);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop_front(&this->m_quOutData);
      p_Var7 = std::
               get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                         ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&lstAddr);
      std::__atomic_base<unsigned_long>::operator-=
                (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,*p_Var7);
      std::mutex::unlock(&this->m_mxOutDeque);
      nPosS = 0;
      p_Var8 = std::
               get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                         ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&lstAddr);
      nPosE = std::__cxx11::string::find((char)p_Var8,0x5b);
      p_Var8 = std::
               get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                         ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&lstAddr);
      local_1f0 = std::__cxx11::string::find((char)p_Var8,0x5d);
      if ((nPosE == 0xffffffffffffffff) || (local_1f0 == -1)) {
        p_Var8 = std::
                 get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                           ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&lstAddr);
        local_240 = std::__cxx11::string::find((char)p_Var8,0x3a);
        if (local_240 == -1) {
          nPos._4_4_ = 3;
        }
        else {
          p_Var8 = std::
                   get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                             ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&lstAddr);
          std::__cxx11::string::substr((ulong)local_260,(ulong)p_Var8);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          p_Var8 = std::
                   get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                             ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&lstAddr);
          std::__cxx11::string::substr((ulong)local_280,(ulong)p_Var8);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          iVar3 = getaddrinfo(pcVar9,pcVar10,(addrinfo *)0x0,(addrinfo **)&nPosS);
          std::__cxx11::string::~string(local_280);
          std::__cxx11::string::~string(local_260);
          if (iVar3 == 0) goto LAB_00137437;
          nPos._4_4_ = 3;
        }
      }
      else {
        p_Var8 = std::
                 get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                           ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&lstAddr);
        std::__cxx11::string::substr((ulong)local_210,(ulong)p_Var8);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        p_Var8 = std::
                 get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                           ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&lstAddr);
        std::__cxx11::string::substr((ulong)local_230,(ulong)p_Var8);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        iVar3 = getaddrinfo(pcVar9,pcVar10,(addrinfo *)0x0,(addrinfo **)&nPosS);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_210);
        if (iVar3 == 0) {
LAB_00137437:
          iVar3 = (this->super_BaseSocketImpl).m_fSock;
          p_Var11 = std::
                    get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                              ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&lstAddr);
          puVar12 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                    operator[](p_Var11,0);
          p_Var7 = std::
                   get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                             ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&lstAddr);
          uVar13 = sendto(iVar3,puVar12,(long)(int)*p_Var7,0,*(sockaddr **)(nPosS + 0x18),
                          *(socklen_t *)(nPosS + 0x10));
          freeaddrinfo((addrinfo *)nPosS);
          if ((int)uVar13 < 1) {
            piVar15 = __errno_location();
            (this->super_BaseSocketImpl).m_iError = *piVar15;
            if ((this->super_BaseSocketImpl).m_iError != 0xb) {
              (this->super_BaseSocketImpl).m_iErrLoc = 6;
              bVar16 = std::function::operator_cast_to_bool
                                 ((function *)&(this->super_BaseSocketImpl).m_fErrorParam);
              if ((bVar16) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
                std::function<void_(BaseSocket_*,_void_*)>::operator()
                          (&(this->super_BaseSocketImpl).m_fErrorParam,
                           (this->super_BaseSocketImpl).m_pBkRef,
                           (this->super_BaseSocketImpl).m_pvUserData);
              }
              else {
                bVar16 = std::function::operator_cast_to_bool
                                   ((function *)&(this->super_BaseSocketImpl).m_fError);
                if ((bVar16) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
                  std::function<void_(BaseSocket_*)>::operator()
                            (&(this->super_BaseSocketImpl).m_fError,
                             (this->super_BaseSocketImpl).m_pBkRef);
                }
              }
              nPos._4_4_ = 3;
              goto LAB_001378b4;
            }
            std::
            get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                      ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&lstAddr);
            std::make_unique<unsigned_char[]>((size_t)&tmp_1);
            p_Var11 = std::
                      get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                                ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&lstAddr);
            puVar12 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      operator[](p_Var11,0);
            p_Var7 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&lstAddr);
            __n = *p_Var7;
            puVar14 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      operator[](&tmp_1,0);
            std::copy_n<unsigned_char*,unsigned_long,unsigned_char*>(puVar12,__n,puVar14);
            std::mutex::lock(&this->m_mxOutDeque);
            p_Var7 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&lstAddr);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,*p_Var7);
            p_Var7 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&lstAddr);
            p_Var8 = std::
                     get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&lstAddr);
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                        *)&this->m_quOutData,&tmp_1,p_Var7,p_Var8);
            std::mutex::unlock(&this->m_mxOutDeque);
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      (&tmp_1);
          }
          else {
            p_Var7 = std::
                     get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                               ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&lstAddr);
            if ((uVar13 & 0xffffffff) < *p_Var7) {
              std::
              get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                        ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&lstAddr);
              std::make_unique<unsigned_char[]>((size_t)&local_298);
              p_Var11 = std::
                        get<0ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                                  ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&lstAddr);
              puVar12 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                        operator[](p_Var11,uVar13 & 0xffffffff);
              p_Var7 = std::
                       get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                                 ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&lstAddr);
              _Var1 = *p_Var7;
              puVar14 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                        operator[](&local_298,0);
              std::copy_n<unsigned_char*,unsigned_long,unsigned_char*>
                        (puVar12,_Var1 - (uVar13 & 0xffffffff),puVar14);
              std::mutex::lock(&this->m_mxOutDeque);
              p_Var7 = std::
                       get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                                 ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&lstAddr);
              std::__atomic_base<unsigned_long>::operator+=
                        (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,
                         *p_Var7 - (uVar13 & 0xffffffff));
              p_Var7 = std::
                       get<1ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                                 ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&lstAddr);
              uStack_2a0 = *p_Var7 - (uVar13 & 0xffffffff);
              p_Var8 = std::
                       get<2ul,std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>
                                 ((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&lstAddr);
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
              ::
              emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string&>
                        ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                          *)&this->m_quOutData,&local_298,&stack0xfffffffffffffd60,p_Var8);
              std::mutex::unlock(&this->m_mxOutDeque);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        (&local_298);
            }
          }
          nPos._4_4_ = 0;
        }
        else {
          nPos._4_4_ = 3;
        }
      }
LAB_001378b4:
      std::
      tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple((tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&lstAddr);
      if (nPos._4_4_ != 0) goto LAB_001378e6;
    }
  } while ((this->m_bCloseReq & 1U) == 0);
LAB_001378e6:
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_58);
  if (((this->super_BaseSocketImpl).m_iError == 0) &&
     (iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,1), iVar3 != 0)) {
    piVar15 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar15;
    (this->super_BaseSocketImpl).m_iErrLoc = 4;
  }
  this_00 = &(this->super_BaseSocketImpl).m_iShutDownState;
  std::__atomic_base<unsigned_char>::operator|=(&this_00->super___atomic_base<unsigned_char>,'\x02')
  ;
  mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
  switch(0x137abb) {
  default:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 2:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 3:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 4:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
  }
  if (local_26) {
    if ((this->super_BaseSocketImpl).m_fSock != -1) {
      close((this->super_BaseSocketImpl).m_fSock);
    }
    (this->super_BaseSocketImpl).m_fSock = -1;
    bVar16 = std::function::operator_cast_to_bool
                       ((function *)&(this->super_BaseSocketImpl).m_fClosing);
    if ((bVar16) ||
       (bVar16 = std::function::operator_cast_to_bool
                           ((function *)&(this->super_BaseSocketImpl).m_fClosingParam), bVar16)) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
  return;
}

Assistant:

void UdpSocketImpl::WriteThread()
{

    unique_lock<mutex> lock(m_mxWrite);

    while (m_bCloseReq == false || m_atOutBytes != 0)
    {
        if (m_bCloseReq == false && m_atOutBytes == 0)
            m_cv.wait(lock, [&]() noexcept { return m_atOutBytes == 0 ? m_bCloseReq : true; });

        if (m_atOutBytes != 0)
        {
            fd_set writefd{}, errorfd{};
            struct timeval timeout{};

            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            FD_ZERO(&writefd);
            FD_ZERO(&errorfd);

            FD_SET(m_fSock, &writefd);
            FD_SET(m_fSock, &errorfd);

            if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) == 0)
            {
                if (m_bCloseReq == false) continue;
                break;
            }

            if (FD_ISSET(m_fSock, &errorfd))
            {
                if (m_iError == 0)
                {
                    socklen_t iLen = sizeof(m_iError);
                    getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                    m_iErrLoc = 5;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                }
                break;
            }

            m_mxOutDeque.lock();
            DATA data = move(m_quOutData.front());
            m_quOutData.pop_front();
            m_atOutBytes -= BUFLEN(data);
            m_mxOutDeque.unlock();

            struct addrinfo *lstAddr = nullptr;
            const size_t nPosS = ADDRESS(data).find('[');
            const size_t nPosE = ADDRESS(data).find(']');
            if (nPosS != string::npos && nPosE != string::npos)
            {
                if (::getaddrinfo(ADDRESS(data).substr(nPosS + 1, nPosE - 1).c_str(), ADDRESS(data).substr(nPosE + 2).c_str(), nullptr, &lstAddr) != 0)
                    break;    // we return 0, because of a wrong address
            }
            else
            {
                const size_t nPos = ADDRESS(data).find(':');
                if (nPos != string::npos)
                {
                    if (::getaddrinfo(ADDRESS(data).substr(0, nPos).c_str(), ADDRESS(data).substr(nPos + 1).c_str(), nullptr, &lstAddr) != 0)
                        break;    // we return 0, because of a wrong address
                }
                else
                    break;    // we return 0, because of a wrong address
            }

            const uint32_t transferred = ::sendto(m_fSock, reinterpret_cast<const char*>(&BUFFER(data)[0]), static_cast<int>(BUFLEN(data)), 0, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen));
            ::freeaddrinfo(lstAddr);
            if (static_cast<int32_t>(transferred) <= 0)
            {
                m_iError = WSAGetLastError();
                if (m_iError != WSAEWOULDBLOCK)
                {
                    m_iErrLoc = 6;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                    break;
                }
                // Put the not send bytes back into the que if it is not a SSL connection. A SSL connection has the bytes still available
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data));
                copy_n(&BUFFER(data)[0], BUFLEN(data), &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += BUFLEN(data);
                m_quOutData.emplace_front(move(tmp), BUFLEN(data), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
            else if (transferred < BUFLEN(data)) // Less bytes send as buffer size, we put the rast back in your que
            {
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data) - transferred);
                copy_n(&BUFFER(data)[transferred], BUFLEN(data) - transferred, &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += (BUFLEN(data) - transferred);
                m_quOutData.emplace_front(move(tmp), (BUFLEN(data) - transferred), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
        }
    }

    lock.unlock();

    // if we get out of the while loop, the stop request was send or we have an error
    if (m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_SEND) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
            m_iErrLoc = 4;
        }
    }
    m_iShutDownState |= 2;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}